

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numTextures,int texWid,
          int texHei,float positionFactor)

{
  int height_;
  float width_;
  char *vtxShaderSource_;
  char *fragShaderSource_;
  Vector<float,_4> local_528;
  Vector<float,_4> local_518;
  TextureSpec local_508;
  int local_4b8;
  int i;
  Matrix<float,_4,_4> local_474;
  allocator<char> local_431;
  string local_430;
  VarSpec local_410;
  int local_368;
  allocator<char> local_361;
  string local_360;
  VarSpec local_340;
  Vector<float,_2> local_294;
  Vector<float,_2> local_28c;
  allocator<char> local_281;
  string local_280;
  VarSpec local_260;
  Vector<float,_3> local_1b4;
  Vector<float,_3> local_1a8;
  allocator<char> local_199;
  string local_198;
  VarSpec local_178;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50;
  undefined1 local_29;
  float local_28;
  int local_24;
  float positionFactor_local;
  int texHei_local;
  int texWid_local;
  int numTextures_local;
  ProgramLibrary *this_local;
  ProgramContext *context;
  
  local_29 = 0;
  local_28 = positionFactor;
  local_24 = texHei;
  positionFactor_local = (float)texWid;
  texHei_local = numTextures;
  _texWid_local = this;
  this_local = (ProgramLibrary *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_IN} mediump vec2 a_texCoord;\n${VTX_OUT} mediump vec2 v_texCoord;\nuniform mediump mat4 u_posTrans;\n\nvoid main (void)\n{\n\tgl_Position = u_posTrans * vec4(a_position, 1.0);\n\tv_texCoord = a_texCoord;\n}\n"
             ,&local_71);
  substitute(&local_50,this,&local_70);
  vtxShaderSource_ = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "${FRAG_HEADER}${FRAG_IN} mediump vec2 v_texCoord;\nuniform mediump sampler2D u_sampler;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = ${TEXTURE_2D_FUNC}(u_sampler, v_texCoord);\n}\n"
             ,&local_c9);
  substitute(&local_a8,this,&local_c8);
  fragShaderSource_ = (char *)std::__cxx11::string::c_str();
  ProgramContext::ProgramContext
            (__return_storage_ptr__,vtxShaderSource_,fragShaderSource_,"a_position");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a_position",&local_199);
  tcu::Vector<float,_3>::Vector(&local_1a8,-local_28);
  tcu::Vector<float,_3>::Vector(&local_1b4,local_28);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_178,&local_198,&local_1a8,&local_1b4);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_178);
  VarSpec::~VarSpec(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"a_texCoord",&local_281);
  tcu::Vector<float,_2>::Vector(&local_28c,0.0);
  tcu::Vector<float,_2>::Vector(&local_294,1.0);
  VarSpec::VarSpec<tcu::Vector<float,2>>(&local_260,&local_280,&local_28c,&local_294);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_260);
  VarSpec::~VarSpec(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"u_sampler",&local_361);
  local_368 = 0;
  VarSpec::VarSpec<int>(&local_340,&local_360,&local_368);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_340);
  VarSpec::~VarSpec(&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"u_posTrans",&local_431);
  translationMat<4>(&local_474,local_28 + -1.0);
  translationMat<4>((Matrix<float,_4,_4> *)&stack0xfffffffffffffb4c,1.0 - local_28);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>
            (&local_410,&local_430,&local_474,(Matrix<float,_4,_4> *)&stack0xfffffffffffffb4c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_410);
  VarSpec::~VarSpec(&local_410);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&stack0xfffffffffffffb4c);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_474);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  for (local_4b8 = 0; width_ = positionFactor_local, height_ = local_24, local_4b8 < texHei_local;
      local_4b8 = local_4b8 + 1) {
    tcu::Vector<float,_4>::Vector(&local_518,0.0);
    tcu::Vector<float,_4>::Vector(&local_528,1.0);
    TextureSpec::TextureSpec
              (&local_508,TEXTURETYPE_2D,0,(int)width_,height_,0x1908,0x1401,0x1908,true,0x2703,
               0x2601,0x2901,0x2901,&local_518,&local_528);
    std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::push_back
              (&__return_storage_ptr__->textureSpecs,&local_508);
  }
  return __return_storage_ptr__;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateTextureContext (const int numTextures, const int texWid, const int texHei, const float positionFactor) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_IN} mediump vec2 a_texCoord;\n"
		"${VTX_OUT} mediump vec2 v_texCoord;\n"
		"uniform mediump mat4 u_posTrans;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = u_posTrans * vec4(a_position, 1.0);\n"
		"	v_texCoord = a_texCoord;\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} mediump vec2 v_texCoord;\n"
		"uniform mediump sampler2D u_sampler;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = ${TEXTURE_2D_FUNC}(u_sampler, v_texCoord);\n"
		"}\n";

	gls::ProgramContext context(substitute(vertexTemplate).c_str(), substitute(fragmentTemplate).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position",		Vec3(-positionFactor),						Vec3(positionFactor)));
	context.attributes.push_back(gls::VarSpec("a_texCoord",		Vec2(0.0f),									Vec2(1.0f)));

	context.uniforms.push_back(gls::VarSpec("u_sampler",		0));
	context.uniforms.push_back(gls::VarSpec("u_posTrans",		translationMat<4>(positionFactor-1.0f),		translationMat<4>(1.0f-positionFactor)));

	for (int i = 0; i < numTextures; i++)
		context.textureSpecs.push_back(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, 0,
														texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA, true,
														GL_LINEAR_MIPMAP_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
														Vec4(0.0f), Vec4(1.0f)));

	return context;
}